

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::singletonRow
          (HighsPostsolveStack *this,HighsInt row,HighsInt col,double coef,bool tightenedColLower,
          bool tightenedColUpper)

{
  reference pvVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  SingletonRow *in_XMM0_Qa;
  value_type vVar2;
  value_type vVar3;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)in_ESI);
  vVar2 = *pvVar1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_EDX);
  vVar3 = *pvVar1;
  HighsDataStack::push<presolve::HighsPostsolveStack::SingletonRow,_0>
            ((HighsDataStack *)CONCAT44(vVar3,vVar2),in_XMM0_Qa);
  reductionAdded((HighsPostsolveStack *)CONCAT44(vVar3,vVar2),
                 (ReductionType)((ulong)in_XMM0_Qa >> 0x38));
  return;
}

Assistant:

void singletonRow(HighsInt row, HighsInt col, double coef,
                    bool tightenedColLower, bool tightenedColUpper) {
    reductionValues.push(SingletonRow{coef, origRowIndex[row],
                                      origColIndex[col], tightenedColLower,
                                      tightenedColUpper});
    reductionAdded(ReductionType::kSingletonRow);
  }